

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O3

void ncnn::conv3x3s2_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_requant,Option *opt)

{
  vector<float,_std::allocator<float>_> local_48;
  
  std::vector<float,_std::allocator<float>_>::vector(&local_48,scales_requant);
  conv_im2col_sgemm_int8_requant_sse
            (bottom_blob,top_blob,(Mat *)_kernel->data,3,3,2,2,(Mat *)_bias->data,&local_48,opt);
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void conv3x3s2_int8_requant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Mat &_bias, std::vector<float> scales_requant, const Option& opt)
{
    int kernel_w = 3;
    int kernel_h = 3;

    int stride_w = 2;
    int stride_h = 2;

    conv_im2col_sgemm_int8_requant_sse(bottom_blob, top_blob, _kernel, kernel_w, kernel_h, stride_w, stride_h, _bias, scales_requant, opt);
}